

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase747::run(TestCase747 *this)

{
  PointerBuilder builder_00;
  ArrayPtr<const_bool> value;
  Reader reader;
  Builder root;
  Maybe<kj::Exception> e;
  MallocMessageBuilder builder;
  Builder local_2d8 [2];
  StructBuilder local_2a8;
  Runnable local_278;
  Builder *local_270;
  Maybe<kj::Exception> local_268;
  MallocMessageBuilder local_100;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(local_2d8,&local_100.super_MessageBuilder);
  local_268.ptr.field_1.value.ownFile.content.size_ = (size_t)local_2d8[0].builder.pointer;
  local_268.ptr._0_8_ = local_2d8[0].builder.segment;
  local_268.ptr.field_1.value.ownFile.content.ptr = (char *)local_2d8[0].builder.capTable;
  PointerBuilder::initStruct(&local_2a8,(PointerBuilder *)&local_268,(StructSize)0x10000);
  local_268.ptr._0_8_ = local_2a8.segment;
  local_268.ptr.field_1.value.ownFile.content.ptr = (char *)local_2a8.capTable;
  local_268.ptr.field_1.value.ownFile.content.size_ = (size_t)local_2a8.pointers;
  local_2d8[0].builder.segment =
       (SegmentBuilder *)CONCAT44(local_2d8[0].builder.segment._4_4_,0x1010001);
  builder_00.capTable = local_2a8.capTable;
  builder_00.segment = local_2a8.segment;
  builder_00.pointer = local_2a8.pointers;
  value.size_ = 4;
  value.ptr = (bool *)local_2d8;
  PointerHelpers<capnp::List<bool,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder_00,value);
  local_2d8[0].builder.segment = (SegmentBuilder *)&PTR_run_0036b820;
  local_2d8[0].builder.capTable = (CapTableBuilder *)&local_2a8;
  kj::_::runCatchingExceptions(&local_268,(Runnable *)local_2d8);
  if ((local_268.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2fb,ERROR,
               "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
               (char (*) [30])"failed: expected e != nullptr",
               (char (*) [33])"Should have thrown an exception.");
  }
  if ((local_268.ptr.isSet & 1U) != 0) {
    kj::Exception::~Exception(&local_268.ptr.field_1.value);
  }
  StructBuilder::asReader(&local_2a8);
  local_278._vptr_Runnable = (_func_int **)&PTR_run_0036b850;
  local_270 = local_2d8;
  kj::_::runCatchingExceptions(&local_268,&local_278);
  if ((local_268.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x308,ERROR,
               "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
               (char (*) [30])"failed: expected e != nullptr",
               (char (*) [33])"Should have thrown an exception.");
  }
  if ((local_268.ptr.isSet & 1U) != 0) {
    kj::Exception::~Exception(&local_268.ptr.field_1.value);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Encoding, BitListUpgrade) {
  // No longer supported!

  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<bool>>({true, false, true, true});

  {
    kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
      root.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
#if !KJ_NO_EXCEPTIONS
      ADD_FAILURE() << "Should have thrown an exception.";
#endif
    });

    KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
  }

  auto reader = root.asReader();

  {
    kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
      reader.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
#if !KJ_NO_EXCEPTIONS
      ADD_FAILURE() << "Should have thrown an exception.";
#endif
    });

    KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
  }
}